

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O1

void __thiscall
QGraphicsProxyWidgetPrivate::sendWidgetMouseEvent
          (QGraphicsProxyWidgetPrivate *this,QGraphicsSceneMouseEvent *event)

{
  QPointer<QWidget> *this_00;
  QPointer<QWidget> *pQVar1;
  Data *pDVar2;
  QGraphicsItem *pQVar3;
  byte bVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  MouseButton MVar8;
  MouseButtons MVar9;
  KeyboardModifiers KVar10;
  MouseEventSource MVar11;
  QFlagsStorage<Qt::MouseButton> QVar12;
  ulong uVar13;
  QWidget *pQVar14;
  QGraphicsItem *pQVar15;
  QPoint QVar16;
  QWidget *pQVar17;
  undefined8 uVar18;
  Data *pDVar19;
  QWeakPointer<QObject> *pQVar20;
  QWidget *nativeWidget;
  ulong uVar21;
  QWeakPointer<QObject> *pQVar22;
  QGraphicsItem *pQVar23;
  long in_FS_OFFSET;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined4 local_12c;
  QCursor widgetsCursor;
  QPoint local_e8;
  QWidget *embeddedMouseGrabberPtr;
  double local_d8;
  QPoint local_d0;
  QGraphicsItem local_c8;
  QMouseEvent mouseEvent;
  QWeakPointer<QObject> local_68;
  QWeakPointer<QObject> local_58;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((event == (QGraphicsSceneMouseEvent *)0x0) ||
       (pDVar19 = (this->widget).wp.d, pDVar19 == (Data *)0x0)) || (*(int *)(pDVar19 + 4) == 0)) ||
     (((this->widget).wp.value == (QObject *)0x0 ||
      ((*(byte *)(*(long *)((this->widget).wp.value + 0x20) + 9) & 0x80) == 0)))) goto LAB_00606571;
  pQVar15 = (this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.q_ptr;
  pQVar23 = pQVar15 + -1;
  if (pQVar15 == (QGraphicsItem *)0x0) {
    pQVar23 = (QGraphicsItem *)0x0;
  }
  local_48.yp._0_4_ = 0xffffffff;
  local_48.xp = -NAN;
  local_48.yp._4_4_ = 0xffffffff;
  local_48 = QGraphicsSceneMouseEvent::pos(event);
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  auVar25 = _DAT_0066f5b0 & (undefined1  [16])local_48 | _DAT_0066f5c0;
  auVar26._0_8_ = auVar25._0_8_ + local_48.xp;
  auVar26._8_8_ = auVar25._8_8_ + local_48.yp;
  auVar25 = minpd(_DAT_0066f5d0,auVar26);
  auVar27._8_8_ = -(ulong)(-2147483648.0 < auVar25._8_8_);
  auVar27._0_8_ = -(ulong)(-2147483648.0 < auVar25._0_8_);
  uVar7 = movmskpd(*(undefined4 *)((this->widget).wp.d + 4),auVar27);
  uVar21 = 0x8000000000000000;
  if ((uVar7 & 2) != 0) {
    uVar21 = (ulong)(uint)(int)auVar25._8_8_ << 0x20;
  }
  uVar13 = 0x80000000;
  if ((uVar7 & 1) != 0) {
    uVar13 = (ulong)(uint)(int)auVar25._0_8_;
  }
  _mouseEvent = (QPoint)(uVar13 | uVar21);
  pQVar14 = QWidget::childAt((QWidget *)(this->widget).wp.value,(QPoint *)&mouseEvent);
  if (pQVar14 == (QWidget *)0x0) {
    local_58.d = (Data *)0x0;
  }
  else {
    local_58.d = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar14->super_QObject);
  }
  local_58.value = &pQVar14->super_QObject;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  if (local_58.d == (Data *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = pQVar14 != (QWidget *)0x0 && *(int *)(local_58.d + 4) != 0;
  }
  pQVar20 = &(this->widget).wp;
  if (bVar5) {
    pQVar20 = &local_58;
  }
  local_68.d = pQVar20->d;
  pQVar20 = &local_58;
  if (!bVar5) {
    pQVar20 = &(this->widget).wp;
  }
  local_68.value = pQVar20->value;
  if (local_68.d == (Data *)0x0) {
LAB_00605cdc:
    pQVar14 = (QWidget *)0x0;
  }
  else {
    LOCK();
    *(int *)local_68.d = *(int *)local_68.d + 1;
    UNLOCK();
    pQVar14 = (QWidget *)local_68.value;
    if (*(int *)(local_68.d + 4) == 0) goto LAB_00605cdc;
  }
  pQVar15 = (QGraphicsItem *)QWidgetPrivate::nearestGraphicsProxyWidget(pQVar14);
  if (pQVar15 != pQVar23) goto LAB_00606529;
  switch(*(undefined2 *)&(event->super_QGraphicsSceneEvent).field_0x8) {
  case 0x9b:
    pDVar19 = (this->embeddedMouseGrabber).wp.d;
    local_12c = 5;
    if (pDVar19 != (Data *)0x0) {
      bVar4 = 0;
      if ((*(int *)(pDVar19 + 4) == 0) || ((this->embeddedMouseGrabber).wp.value == (QObject *)0x0))
      goto LAB_00605e4a;
      QWeakPointer<QObject>::operator=(&local_68,&(this->embeddedMouseGrabber).wp);
    }
    break;
  case 0x9c:
    pQVar20 = &(this->embeddedMouseGrabber).wp;
    pDVar19 = (this->embeddedMouseGrabber).wp.d;
    if (((pDVar19 == (Data *)0x0) || (*(int *)(pDVar19 + 4) == 0)) ||
       ((this->embeddedMouseGrabber).wp.value == (QObject *)0x0)) {
      pQVar22 = &local_68;
    }
    else {
      pQVar22 = pQVar20;
      pQVar20 = &local_68;
    }
    QWeakPointer<QObject>::operator=(pQVar20,pQVar22);
    local_12c = 2;
    break;
  case 0x9d:
    pDVar19 = (this->embeddedMouseGrabber).wp.d;
    local_12c = 3;
    bVar4 = 1;
    if (((pDVar19 != (Data *)0x0) && (*(int *)(pDVar19 + 4) != 0)) &&
       ((this->embeddedMouseGrabber).wp.value != (QObject *)0x0)) {
      QWeakPointer<QObject>::operator=(&local_68,&(this->embeddedMouseGrabber).wp);
    }
    goto LAB_00605e4a;
  case 0x9e:
    pQVar20 = &(this->embeddedMouseGrabber).wp;
    pDVar19 = (this->embeddedMouseGrabber).wp.d;
    if (((pDVar19 == (Data *)0x0) || (*(int *)(pDVar19 + 4) == 0)) ||
       ((this->embeddedMouseGrabber).wp.value == (QObject *)0x0)) {
      pQVar22 = &local_68;
    }
    else {
      pQVar22 = pQVar20;
      pQVar20 = &local_68;
    }
    QWeakPointer<QObject>::operator=(pQVar20,pQVar22);
    local_12c = 4;
    break;
  default:
    bVar4 = 0;
    local_12c = 0;
    goto LAB_00605e4a;
  }
  bVar4 = 0;
LAB_00605e4a:
  this_00 = &this->lastWidgetUnderMouse;
  pDVar19 = (this->lastWidgetUnderMouse).wp.d;
  if (((pDVar19 == (Data *)0x0) || (*(int *)(pDVar19 + 4) == 0)) ||
     ((this->lastWidgetUnderMouse).wp.value == (QObject *)0x0)) {
    pDVar19 = (this->embeddedMouseGrabber).wp.d;
    if ((pDVar19 == (Data *)0x0) || (*(int *)(pDVar19 + 4) == 0)) {
      bVar5 = false;
    }
    else {
      bVar5 = (this->embeddedMouseGrabber).wp.value != (QObject *)0x0;
    }
    pQVar20 = &local_68;
    if (bVar5) {
      pQVar20 = &(this->embeddedMouseGrabber).wp;
    }
    if ((pQVar20->d == (Data *)0x0) || (*(int *)(pQVar20->d + 4) == 0)) {
      pQVar14 = (QWidget *)0x0;
    }
    else {
      pQVar20 = &local_68;
      if (bVar5) {
        pQVar20 = &(this->embeddedMouseGrabber).wp;
      }
      pQVar14 = (QWidget *)pQVar20->value;
    }
    QVar16 = QGraphicsSceneMouseEvent::screenPos(event);
    _mouseEvent = (QPoint)(double)QVar16.xp.m_i.m_i;
    QApplicationPrivate::dispatchEnterLeave(pQVar14,(QWidget *)0x0,(QPointF *)&mouseEvent);
    QWeakPointer<QObject>::operator=(&this_00->wp,&local_68);
  }
  if ((local_68.d == (Data *)0x0) ||
     (pQVar14 = (QWidget *)local_68.value, *(int *)(local_68.d + 4) == 0)) {
    pQVar14 = (QWidget *)0x0;
  }
  local_48 = mapToReceiver(this,&local_48,pQVar14);
  _mouseEvent = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  if ((local_68.d == (Data *)0x0) ||
     (pQVar14 = (QWidget *)local_68.value, *(int *)(local_68.d + 4) == 0)) {
    pQVar14 = (QWidget *)0x0;
  }
  pQVar17 = QWidget::window((QWidget *)local_68.value);
  dVar28 = (double)((ulong)local_48.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_48.xp;
  dVar24 = 2147483647.0;
  if (dVar28 <= 2147483647.0) {
    dVar24 = dVar28;
  }
  if (dVar24 <= -2147483648.0) {
    dVar24 = -2147483648.0;
  }
  local_d0.xp.m_i = (int)dVar24;
  dVar28 = (double)((ulong)local_48.yp & 0x8000000000000000 | 0x3fe0000000000000) + local_48.yp;
  dVar24 = 2147483647.0;
  if (dVar28 <= 2147483647.0) {
    dVar24 = dVar28;
  }
  if (dVar24 <= -2147483648.0) {
    dVar24 = -2147483648.0;
  }
  local_d0.yp.m_i = (int)dVar24;
  QVar16 = QWidget::mapTo(pQVar14,pQVar17,&local_d0);
  local_c8.d_ptr.d = (QGraphicsItemPrivate *)(double)QVar16.yp.m_i.m_i;
  local_c8._vptr_QGraphicsItem = (_func_int **)(double)QVar16.xp.m_i.m_i;
  dVar28 = (double)((ulong)local_48.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_48.xp;
  dVar24 = 2147483647.0;
  if (dVar28 <= 2147483647.0) {
    dVar24 = dVar28;
  }
  if (dVar24 <= -2147483648.0) {
    dVar24 = -2147483648.0;
  }
  local_e8.xp.m_i = (int)dVar24;
  dVar28 = (double)((ulong)local_48.yp & 0x8000000000000000 | 0x3fe0000000000000) + local_48.yp;
  dVar24 = 2147483647.0;
  if (dVar28 <= 2147483647.0) {
    dVar24 = dVar28;
  }
  if (dVar24 <= -2147483648.0) {
    dVar24 = -2147483648.0;
  }
  local_e8.yp.m_i = (int)dVar24;
  QVar16 = QWidget::mapToGlobal((QWidget *)local_68.value,&local_e8);
  embeddedMouseGrabberPtr = (QWidget *)(double)QVar16.xp.m_i.m_i;
  local_d8 = (double)QVar16.yp.m_i.m_i;
  MVar8 = QGraphicsSceneMouseEvent::button(event);
  MVar9 = QGraphicsSceneMouseEvent::buttons(event);
  KVar10 = QGraphicsSceneMouseEvent::modifiers(event);
  MVar11 = QGraphicsSceneMouseEvent::source(event);
  widgetsCursor.d = (QCursorData *)0x0;
  uVar18 = QPointingDevice::primaryPointingDevice((QString *)&widgetsCursor);
  QMouseEvent::QMouseEvent
            (&mouseEvent,local_12c,&local_48,&local_c8,&embeddedMouseGrabberPtr,MVar8,
             MVar9.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
             super_QFlagsStorage<Qt::MouseButton>.i,
             KVar10.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
             super_QFlagsStorage<Qt::KeyboardModifier>.i,MVar11,uVar18);
  if (widgetsCursor.d != (QCursorData *)0x0) {
    LOCK();
    *(int *)widgetsCursor.d = *(int *)widgetsCursor.d + -1;
    UNLOCK();
    if (*(int *)widgetsCursor.d == 0) {
      QArrayData::deallocate((QArrayData *)widgetsCursor.d,2,0x10);
    }
  }
  QGraphicsSceneEvent::timestamp(&event->super_QGraphicsSceneEvent);
  QPointerEvent::setTimestamp((ulonglong)&mouseEvent);
  pDVar19 = (this->embeddedMouseGrabber).wp.d;
  if ((pDVar19 == (Data *)0x0) || (*(int *)(pDVar19 + 4) == 0)) {
    embeddedMouseGrabberPtr = (QWidget *)0x0;
  }
  else {
    embeddedMouseGrabberPtr = (QWidget *)(this->embeddedMouseGrabber).wp.value;
  }
  if ((local_68.d == (Data *)0x0) ||
     (pQVar14 = (QWidget *)local_68.value, *(int *)(local_68.d + 4) == 0)) {
    pQVar14 = (QWidget *)0x0;
  }
  pQVar20 = &(this->widget).wp;
  if ((local_58.d == (Data *)0x0) ||
     (pQVar17 = (QWidget *)local_58.value, *(int *)(local_58.d + 4) == 0)) {
    pQVar17 = (QWidget *)0x0;
  }
  pDVar19 = (((QPointer<QWidget> *)pQVar20)->wp).d;
  if ((pDVar19 == (Data *)0x0) || (*(int *)(pDVar19 + 4) == 0)) {
    nativeWidget = (QWidget *)0x0;
  }
  else {
    nativeWidget = (QWidget *)(this->widget).wp.value;
  }
  QApplicationPrivate::sendMouseEvent
            (pQVar14,&mouseEvent,pQVar17,nativeWidget,&embeddedMouseGrabberPtr,this_00,
             (bool)(event->super_QGraphicsSceneEvent).field_0xb,false);
  pQVar14 = embeddedMouseGrabberPtr;
  if (embeddedMouseGrabberPtr == (QWidget *)0x0) {
    pDVar19 = (Data *)0x0;
  }
  else {
    pDVar19 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef
                                (&embeddedMouseGrabberPtr->super_QObject);
  }
  pQVar1 = &this->embeddedMouseGrabber;
  pDVar2 = (this->embeddedMouseGrabber).wp.d;
  (this->embeddedMouseGrabber).wp.d = pDVar19;
  (this->embeddedMouseGrabber).wp.value = &pQVar14->super_QObject;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if (*(int *)pDVar2 == 0) {
      operator_delete(pDVar2);
    }
  }
  pDVar19 = (pQVar1->wp).d;
  if ((pDVar19 == (Data *)0x0) || (*(int *)(pDVar19 + 4) == 0)) {
    bVar5 = false;
  }
  else {
    bVar5 = (this->embeddedMouseGrabber).wp.value != (QObject *)0x0;
  }
  if (((bool)(bVar4 & bVar5)) &&
     (QVar12.i = (Int)QGraphicsSceneMouseEvent::buttons(event),
     (QFlagsStorage<Qt::MouseButton>)QVar12.i == (QFlagsStorage<Qt::MouseButton>)0x0)) {
    pQVar3 = (this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.q_ptr;
    pQVar15 = pQVar3 + -1;
    if (pQVar3 == (QGraphicsItem *)0x0) {
      pQVar15 = (QGraphicsItem *)0x0;
    }
    QGraphicsWidget::size((QGraphicsWidget *)pQVar15);
    widgetsCursor.d = (QCursorData *)0x0;
    local_c8 = (QGraphicsItem)QGraphicsSceneMouseEvent::pos(event);
    cVar6 = QRectF::contains((QPointF *)&widgetsCursor);
    if ((cVar6 == '\0') || (bVar5 = QGraphicsItem::acceptHoverEvents(pQVar15 + 1), !bVar5)) {
      pDVar19 = (this_00->wp).d;
      (this_00->wp).d = (Data *)0x0;
      (this->lastWidgetUnderMouse).wp.value = (QObject *)0x0;
      if (pDVar19 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar19 = *(int *)pDVar19 + -1;
        UNLOCK();
        if (*(int *)pDVar19 == 0) {
          operator_delete(pDVar19);
        }
      }
    }
    else {
      if (((local_58.d != (Data *)0x0) && (*(int *)(local_58.d + 4) != 0)) &&
         ((QWidget *)local_58.value != (QWidget *)0x0)) {
        pQVar20 = &local_58;
      }
      QWeakPointer<QObject>::operator=(&this_00->wp,pQVar20);
    }
    pDVar19 = (this_00->wp).d;
    if ((pDVar19 == (Data *)0x0) || (*(int *)(pDVar19 + 4) == 0)) {
      pQVar14 = (QWidget *)0x0;
    }
    else {
      pQVar14 = (QWidget *)(this->lastWidgetUnderMouse).wp.value;
    }
    pDVar19 = (pQVar1->wp).d;
    if ((pDVar19 == (Data *)0x0) || (*(int *)(pDVar19 + 4) == 0)) {
      pQVar17 = (QWidget *)0x0;
    }
    else {
      pQVar17 = (QWidget *)(this->embeddedMouseGrabber).wp.value;
    }
    QVar16 = QGraphicsSceneMouseEvent::screenPos(event);
    widgetsCursor.d = (QCursorData *)(double)QVar16.xp.m_i.m_i;
    QApplicationPrivate::dispatchEnterLeave(pQVar14,pQVar17,(QPointF *)&widgetsCursor);
    pDVar19 = (pQVar1->wp).d;
    (pQVar1->wp).d = (Data *)0x0;
    (this->embeddedMouseGrabber).wp.value = (QObject *)0x0;
    if (pDVar19 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar19 = *(int *)pDVar19 + -1;
      UNLOCK();
      if (*(int *)pDVar19 == 0) {
        operator_delete(pDVar19);
      }
    }
    pDVar19 = (this_00->wp).d;
    if (((pDVar19 == (Data *)0x0) || (*(int *)(pDVar19 + 4) == 0)) ||
       ((this->lastWidgetUnderMouse).wp.value == (QObject *)0x0)) {
      QGraphicsItem::unsetCursor(pQVar15 + 1);
    }
  }
  pDVar19 = (this_00->wp).d;
  if (((pDVar19 != (Data *)0x0) && (*(int *)(pDVar19 + 4) != 0)) &&
     ((this->lastWidgetUnderMouse).wp.value != (QObject *)0x0)) {
    widgetsCursor.d = (QCursorData *)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::cursor((QWidget *)&widgetsCursor);
    QGraphicsItem::cursor(&local_c8);
    cVar6 = ::operator==((QCursor *)&local_c8,&widgetsCursor);
    QCursor::~QCursor((QCursor *)&local_c8);
    if (cVar6 == '\0') {
      QGraphicsItem::setCursor(pQVar23 + 1,&widgetsCursor);
    }
    QCursor::~QCursor(&widgetsCursor);
  }
  (**(code **)(*(long *)&event->super_QGraphicsSceneEvent + 0x10))(event,0xaa);
  QMouseEvent::~QMouseEvent(&mouseEvent);
LAB_00606529:
  if (local_68.d != (Data *)0x0) {
    LOCK();
    *(int *)local_68.d = *(int *)local_68.d + -1;
    UNLOCK();
    if ((*(int *)local_68.d == 0) && (local_68.d != (Data *)0x0)) {
      operator_delete(local_68.d);
    }
  }
  if (local_58.d != (Data *)0x0) {
    LOCK();
    *(int *)local_58.d = *(int *)local_58.d + -1;
    UNLOCK();
    if ((*(int *)local_58.d == 0) && (local_58.d != (Data *)0x0)) {
      operator_delete(local_58.d);
    }
  }
LAB_00606571:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidgetPrivate::sendWidgetMouseEvent(QGraphicsSceneMouseEvent *event)
{
    if (!event || !widget || !widget->isVisible())
        return;
    Q_Q(QGraphicsProxyWidget);

    // Find widget position and receiver.
    QPointF pos = event->pos();
    QPointer<QWidget> alienWidget = widget->childAt(pos.toPoint());
    QPointer<QWidget> receiver =  alienWidget ? alienWidget : widget;

    if (QWidgetPrivate::nearestGraphicsProxyWidget(receiver) != q)
        return; //another proxywidget will handle the events

    // Translate QGraphicsSceneMouse events to QMouseEvents.
    QEvent::Type type = QEvent::None;
    switch (event->type()) {
    case QEvent::GraphicsSceneMousePress:
        type = QEvent::MouseButtonPress;
        if (!embeddedMouseGrabber)
            embeddedMouseGrabber = receiver;
        else
            receiver = embeddedMouseGrabber;
        break;
    case QEvent::GraphicsSceneMouseRelease:
        type = QEvent::MouseButtonRelease;
        if (embeddedMouseGrabber)
            receiver = embeddedMouseGrabber;
        break;
    case QEvent::GraphicsSceneMouseDoubleClick:
        type = QEvent::MouseButtonDblClick;
        if (!embeddedMouseGrabber)
            embeddedMouseGrabber = receiver;
        else
            receiver = embeddedMouseGrabber;
        break;
    case QEvent::GraphicsSceneMouseMove:
        type = QEvent::MouseMove;
        if (embeddedMouseGrabber)
            receiver = embeddedMouseGrabber;
        break;
    default:
        Q_ASSERT_X(false, "QGraphicsProxyWidget", "internal error");
        break;
    }

    if (!lastWidgetUnderMouse) {
        QApplicationPrivate::dispatchEnterLeave(embeddedMouseGrabber ? embeddedMouseGrabber : receiver, nullptr, event->screenPos());
        lastWidgetUnderMouse = receiver;
    }

    // Map event position from us to the receiver
    pos = mapToReceiver(pos, receiver);

    // Send mouse event.
    QMouseEvent mouseEvent(type, pos, receiver->mapTo(receiver->topLevelWidget(), pos.toPoint()),
                           receiver->mapToGlobal(pos.toPoint()),
                           event->button(), event->buttons(), event->modifiers(), event->source());
    mouseEvent.setTimestamp(event->timestamp());

    QWidget *embeddedMouseGrabberPtr = (QWidget *)embeddedMouseGrabber;
    QApplicationPrivate::sendMouseEvent(receiver, &mouseEvent, alienWidget, widget,
                                        &embeddedMouseGrabberPtr, lastWidgetUnderMouse, event->spontaneous());
    embeddedMouseGrabber = embeddedMouseGrabberPtr;

    // Handle enter/leave events when last button is released from mouse
    // grabber child widget.
    if (embeddedMouseGrabber && type == QEvent::MouseButtonRelease && !event->buttons()) {
        Q_Q(QGraphicsProxyWidget);
        if (q->rect().contains(event->pos()) && q->acceptHoverEvents())
            lastWidgetUnderMouse = alienWidget ? alienWidget : widget;
        else // released on the frame our outside the item, or doesn't accept hover events.
            lastWidgetUnderMouse = nullptr;

        QApplicationPrivate::dispatchEnterLeave(lastWidgetUnderMouse, embeddedMouseGrabber, event->screenPos());
        embeddedMouseGrabber = nullptr;

#ifndef QT_NO_CURSOR
        // ### Restore the cursor, don't override it.
        if (!lastWidgetUnderMouse)
            q->unsetCursor();
#endif
    }

#ifndef QT_NO_CURSOR
    // Keep cursor in sync
    if (lastWidgetUnderMouse) {
        QCursor widgetsCursor = lastWidgetUnderMouse->cursor();
        if (q->cursor() != widgetsCursor)
            q->setCursor(widgetsCursor);
    }
#endif

    event->setAccepted(mouseEvent.isAccepted());
}